

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_event_configchg.c
# Opt level: O1

void ares_event_configchg_destroy(ares_event_configchg_t *configchg)

{
  if (configchg != (ares_event_configchg_t *)0x0) {
    ares_event_update((ares_event_t **)0x0,configchg->e,ARES_EVENT_FLAG_NONE,(ares_event_cb_t)0x0,
                      configchg->inotify_fd,(void *)0x0,(ares_event_free_data_t)0x0,
                      (ares_event_signal_cb_t)0x0);
  }
  return;
}

Assistant:

void ares_event_configchg_destroy(ares_event_configchg_t *configchg)
{
  if (configchg == NULL) {
    return; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  /* Tell event system to stop monitoring for changes.  This will cause the
   * cleanup to be called */
  ares_event_update(NULL, configchg->e, ARES_EVENT_FLAG_NONE, NULL,
                    configchg->inotify_fd, NULL, NULL, NULL);
}